

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O1

int wally_hex_from_bytes(uchar *bytes,size_t bytes_len,char **output)

{
  size_t size;
  int iVar1;
  char *dest;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar1 = -2;
  if (bytes != (uchar *)0x0 && output != (char **)0x0) {
    size = bytes_len * 2 + 1;
    dest = (char *)wally_malloc(size);
    *output = dest;
    if (dest == (char *)0x0) {
      iVar1 = -3;
    }
    else {
      hex_encode(bytes,bytes_len,dest,size);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_hex_from_bytes(const unsigned char *bytes, size_t bytes_len,
                         char **output)
{
    if (output)
        *output = NULL;

    if (!bytes || !output)
        return WALLY_EINVAL;

    *output = wally_malloc(hex_str_size(bytes_len));
    if (!*output)
        return WALLY_ENOMEM;

    /* Note we ignore the return value as this call cannot fail */
    hex_encode(bytes, bytes_len, *output, hex_str_size(bytes_len));
    return WALLY_OK;
}